

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3SetHasStat(Fts3Table *p)

{
  int iVar1;
  char *zTableName;
  int res;
  char *zTbl;
  int rc;
  Fts3Table *p_local;
  
  zTbl._4_4_ = 0;
  if (p->bHasStat == '\x02') {
    zTableName = sqlite3_mprintf("%s_stat",p->zName);
    if (zTableName == (char *)0x0) {
      zTbl._4_4_ = 7;
    }
    else {
      iVar1 = sqlite3_table_column_metadata
                        (p->db,p->zDb,zTableName,(char *)0x0,(char **)0x0,(char **)0x0,(int *)0x0,
                         (int *)0x0,(int *)0x0);
      sqlite3_free(zTableName);
      p->bHasStat = iVar1 == 0;
    }
  }
  return zTbl._4_4_;
}

Assistant:

static int fts3SetHasStat(Fts3Table *p){
  int rc = SQLITE_OK;
  if( p->bHasStat==2 ){
    char *zTbl = sqlite3_mprintf("%s_stat", p->zName);
    if( zTbl ){
      int res = sqlite3_table_column_metadata(p->db, p->zDb, zTbl, 0,0,0,0,0,0);
      sqlite3_free(zTbl);
      p->bHasStat = (res==SQLITE_OK);
    }else{
      rc = SQLITE_NOMEM;
    }
  }
  return rc;
}